

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__init_private__ogg
                    (ma_dr_flac_init_info *pInit,ma_dr_flac_read_proc onRead,
                    ma_dr_flac_seek_proc onSeek,ma_dr_flac_meta_proc onMeta,void *pUserData,
                    void *pUserDataMD,ma_bool32 relaxed)

{
  ma_uint64 mVar1;
  uint uVar2;
  ma_result mVar3;
  ma_bool32 mVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  ma_uint32 pageBodySize;
  int iVar8;
  ma_uint8 packetType;
  ma_uint32 bytesRead;
  ma_uint8 mappingVersion [2];
  ma_uint8 sig [4];
  ma_uint32 crc32;
  void *local_250;
  ma_dr_flac_meta_proc local_248;
  ma_dr_flac_ogg_page_header *local_240;
  void *local_238;
  ma_dr_flac_streaminfo streaminfo;
  ma_dr_flac_metadata metadata;
  ma_dr_flac_ogg_page_header header;
  
  crc32 = 0x5fb0a94f;
  bytesRead = 0;
  pInit->container = ma_dr_flac_container_ogg;
  pInit->oggFirstBytePos = 0;
  mVar3 = ma_dr_flac_ogg__read_page_header_after_capture_pattern
                    (onRead,pUserData,&header,&bytesRead,&crc32);
  mVar4 = 0;
  if (mVar3 == MA_SUCCESS) {
    pInit->runningFilePos = pInit->runningFilePos + (ulong)bytesRead;
    local_240 = &pInit->oggBosHeader;
    local_250 = pUserDataMD;
    local_248 = onMeta;
    local_238 = pUserData;
    do {
      if ((header.headerType & 2) == 0) goto LAB_00163542;
      iVar8 = 0;
      for (uVar7 = 0; header.segmentCount != uVar7; uVar7 = uVar7 + 1) {
        iVar8 = iVar8 + (uint)header.segmentTable[uVar7];
      }
      if (iVar8 == 0x33) {
        sVar5 = (*onRead)(pUserData,&packetType,1);
        iVar6 = 1;
        if (sVar5 == 1) {
          if (packetType == '\x7f') {
            sVar5 = (*onRead)(pUserData,sig,4);
            iVar6 = 1;
            if (sVar5 == 4) {
              if (sig != (ma_uint8  [4])0x43414c46) {
                mVar4 = (*onSeek)(pUserData,0x2e,ma_dr_flac_seek_origin_current);
                goto LAB_00163519;
              }
              sVar5 = (*onRead)(pUserData,mappingVersion,2);
              iVar6 = 1;
              if ((sVar5 == 2) && (iVar6 = 1, mappingVersion[0] == '\x01')) {
                mVar4 = (*onSeek)(pUserData,2,ma_dr_flac_seek_origin_current);
                iVar6 = 1;
                if (mVar4 != 0) {
                  sVar5 = (*onRead)(pUserData,sig,4);
                  iVar6 = 1;
                  if ((sVar5 == 4) && (iVar6 = 1, sig == (ma_uint8  [4])0x43614c66)) {
                    sVar5 = (*onRead)(pUserData,&metadata,4);
                    iVar6 = 1;
                    if ((sVar5 == 4) &&
                       (uVar2 = metadata.type << 0x18,
                       (metadata.type >> 0x18 | (metadata.type & 0xff0000) >> 8 |
                        (metadata.type & 0xff00) << 8 | uVar2 & 0x7fffffff) == 0x22)) {
                      mVar4 = ma_dr_flac__read_streaminfo(onRead,pUserData,&streaminfo);
                      iVar6 = 1;
                      if (mVar4 != 0) {
                        pInit->hasStreamInfoBlock = 1;
                        pInit->sampleRate = streaminfo.sampleRate;
                        pInit->channels = streaminfo.channels;
                        pInit->bitsPerSample = streaminfo.bitsPerSample;
                        pInit->totalPCMFrameCount =
                             CONCAT44(streaminfo.totalPCMFrameCount._4_4_,
                                      (undefined4)streaminfo.totalPCMFrameCount);
                        pInit->maxBlockSizeInPCMFrames = streaminfo.maxBlockSizeInPCMFrames;
                        pInit->hasMetadataBlocks = ~uVar2 >> 0x1f;
                        if (local_248 != (ma_dr_flac_meta_proc)0x0) {
                          metadata.type = 0;
                          metadata.pRawData = (void *)0x0;
                          metadata.rawDataSize = 0;
                          metadata.data._32_1_ = streaminfo.md5[0];
                          metadata.data._33_1_ = streaminfo.md5[1];
                          metadata.data._34_1_ = streaminfo.md5[2];
                          metadata.data._35_1_ = streaminfo.md5[3];
                          metadata.data._36_1_ = streaminfo.md5[4];
                          metadata.data._37_1_ = streaminfo.md5[5];
                          metadata.data._38_1_ = streaminfo.md5[6];
                          metadata.data._39_1_ = streaminfo.md5[7];
                          metadata.data._40_1_ = streaminfo.md5[8];
                          metadata.data._41_1_ = streaminfo.md5[9];
                          metadata.data._42_1_ = streaminfo.md5[10];
                          metadata.data._43_1_ = streaminfo.md5[0xb];
                          metadata.data._44_1_ = streaminfo.md5[0xc];
                          metadata.data._45_1_ = streaminfo.md5[0xd];
                          metadata.data._46_1_ = streaminfo.md5[0xe];
                          metadata.data._47_1_ = streaminfo.md5[0xf];
                          metadata.data._16_1_ = streaminfo.channels;
                          metadata.data._17_1_ = streaminfo.bitsPerSample;
                          metadata.data._18_2_ = streaminfo._18_2_;
                          metadata.data._20_4_ = streaminfo._20_4_;
                          metadata.data.streaminfo.totalPCMFrameCount._0_4_ =
                               (undefined4)streaminfo.totalPCMFrameCount;
                          metadata.data.streaminfo.totalPCMFrameCount._4_4_ =
                               streaminfo.totalPCMFrameCount._4_4_;
                          metadata.data.padding.unused =
                               (anon_struct_4_1_6f0ff714_for_padding)
                               (anon_struct_4_1_6f0ff714_for_padding)streaminfo._0_4_;
                          metadata.data.streaminfo.minFrameSizeInPCMFrames =
                               streaminfo.minFrameSizeInPCMFrames;
                          metadata.data.streaminfo.maxFrameSizeInPCMFrames =
                               streaminfo.maxFrameSizeInPCMFrames;
                          metadata.data.streaminfo.sampleRate = streaminfo.sampleRate;
                          (*local_248)(local_250,&metadata);
                        }
                        mVar1 = pInit->runningFilePos;
                        pInit->runningFilePos = mVar1 + 0x33;
                        pInit->oggFirstBytePos = mVar1 - 0x1c;
                        pInit->oggSerial = header.serialNumber;
                        memcpy(local_240,&header,0x120);
                        iVar6 = 2;
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            mVar4 = (*onSeek)(pUserData,0x32,ma_dr_flac_seek_origin_current);
            pUserData = local_238;
LAB_00163519:
            iVar6 = 1;
            if (mVar4 != 0) goto LAB_001634ae;
          }
        }
      }
      else {
        mVar4 = (*onSeek)(pUserData,iVar8,ma_dr_flac_seek_origin_current);
        if (mVar4 == 0) goto LAB_00163542;
LAB_001634ae:
        pInit->runningFilePos = pInit->runningFilePos + (long)iVar8;
        mVar3 = ma_dr_flac_ogg__read_page_header(onRead,pUserData,&header,&bytesRead,&crc32);
        if (mVar3 != MA_SUCCESS) goto LAB_00163542;
        pInit->runningFilePos = pInit->runningFilePos + (ulong)bytesRead;
        iVar6 = 0;
      }
    } while (iVar6 == 0);
    if (iVar6 == 2) {
      pInit->hasMetadataBlocks = 1;
      mVar4 = 1;
    }
    else {
LAB_00163542:
      mVar4 = 0;
    }
  }
  return mVar4;
}

Assistant:

static ma_bool32 ma_dr_flac__init_private__ogg(ma_dr_flac_init_info* pInit, ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, ma_dr_flac_meta_proc onMeta, void* pUserData, void* pUserDataMD, ma_bool32 relaxed)
{
    ma_dr_flac_ogg_page_header header;
    ma_uint32 crc32 = MA_DR_FLAC_OGG_CAPTURE_PATTERN_CRC32;
    ma_uint32 bytesRead = 0;
    (void)relaxed;
    pInit->container = ma_dr_flac_container_ogg;
    pInit->oggFirstBytePos = 0;
    if (ma_dr_flac_ogg__read_page_header_after_capture_pattern(onRead, pUserData, &header, &bytesRead, &crc32) != MA_SUCCESS) {
        return MA_FALSE;
    }
    pInit->runningFilePos += bytesRead;
    for (;;) {
        int pageBodySize;
        if ((header.headerType & 0x02) == 0) {
            return MA_FALSE;
        }
        pageBodySize = ma_dr_flac_ogg__get_page_body_size(&header);
        if (pageBodySize == 51) {
            ma_uint32 bytesRemainingInPage = pageBodySize;
            ma_uint8 packetType;
            if (onRead(pUserData, &packetType, 1) != 1) {
                return MA_FALSE;
            }
            bytesRemainingInPage -= 1;
            if (packetType == 0x7F) {
                ma_uint8 sig[4];
                if (onRead(pUserData, sig, 4) != 4) {
                    return MA_FALSE;
                }
                bytesRemainingInPage -= 4;
                if (sig[0] == 'F' && sig[1] == 'L' && sig[2] == 'A' && sig[3] == 'C') {
                    ma_uint8 mappingVersion[2];
                    if (onRead(pUserData, mappingVersion, 2) != 2) {
                        return MA_FALSE;
                    }
                    if (mappingVersion[0] != 1) {
                        return MA_FALSE;
                    }
                    if (!onSeek(pUserData, 2, ma_dr_flac_seek_origin_current)) {
                        return MA_FALSE;
                    }
                    if (onRead(pUserData, sig, 4) != 4) {
                        return MA_FALSE;
                    }
                    if (sig[0] == 'f' && sig[1] == 'L' && sig[2] == 'a' && sig[3] == 'C') {
                        ma_dr_flac_streaminfo streaminfo;
                        ma_uint8 isLastBlock;
                        ma_uint8 blockType;
                        ma_uint32 blockSize;
                        if (!ma_dr_flac__read_and_decode_block_header(onRead, pUserData, &isLastBlock, &blockType, &blockSize)) {
                            return MA_FALSE;
                        }
                        if (blockType != MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO || blockSize != 34) {
                            return MA_FALSE;
                        }
                        if (ma_dr_flac__read_streaminfo(onRead, pUserData, &streaminfo)) {
                            pInit->hasStreamInfoBlock      = MA_TRUE;
                            pInit->sampleRate              = streaminfo.sampleRate;
                            pInit->channels                = streaminfo.channels;
                            pInit->bitsPerSample           = streaminfo.bitsPerSample;
                            pInit->totalPCMFrameCount      = streaminfo.totalPCMFrameCount;
                            pInit->maxBlockSizeInPCMFrames = streaminfo.maxBlockSizeInPCMFrames;
                            pInit->hasMetadataBlocks       = !isLastBlock;
                            if (onMeta) {
                                ma_dr_flac_metadata metadata;
                                metadata.type = MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO;
                                metadata.pRawData = NULL;
                                metadata.rawDataSize = 0;
                                metadata.data.streaminfo = streaminfo;
                                onMeta(pUserDataMD, &metadata);
                            }
                            pInit->runningFilePos  += pageBodySize;
                            pInit->oggFirstBytePos  = pInit->runningFilePos - 79;
                            pInit->oggSerial        = header.serialNumber;
                            pInit->oggBosHeader     = header;
                            break;
                        } else {
                            return MA_FALSE;
                        }
                    } else {
                        return MA_FALSE;
                    }
                } else {
                    if (!onSeek(pUserData, bytesRemainingInPage, ma_dr_flac_seek_origin_current)) {
                        return MA_FALSE;
                    }
                }
            } else {
                if (!onSeek(pUserData, bytesRemainingInPage, ma_dr_flac_seek_origin_current)) {
                    return MA_FALSE;
                }
            }
        } else {
            if (!onSeek(pUserData, pageBodySize, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
        }
        pInit->runningFilePos += pageBodySize;
        if (ma_dr_flac_ogg__read_page_header(onRead, pUserData, &header, &bytesRead, &crc32) != MA_SUCCESS) {
            return MA_FALSE;
        }
        pInit->runningFilePos += bytesRead;
    }
    pInit->hasMetadataBlocks = MA_TRUE;
    return MA_TRUE;
}